

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,2ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *attr,
          string *name,uint32_t indent)

{
  tinyusdz *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tinyusdz tVar2;
  tinyusdz tVar3;
  Animatable<std::array<float,_2UL>_> *pAVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  ostream *poVar8;
  uint32_t indent_00;
  long lVar9;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n_01;
  byte bVar10;
  bool bVar11;
  stringstream ss;
  string local_210;
  Animatable<std::array<float,_2UL>_> *local_1f0;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = (Animatable<std::array<float,_2UL>_> *)name;
  local_1e8 = attr;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  tVar2 = this[0x220];
  tVar3 = this[600];
  if (tVar3 == (tinyusdz)0x0) {
    if (((byte)tVar2 & 1) == 0) {
      lVar7 = 0x260;
      bVar10 = 1;
      if ((*(long *)(this + 0x210) == *(long *)(this + 0x208)) && (this[0x290] == (tinyusdz)0x0))
      goto LAB_002dbcd2;
    }
    else {
      lVar7 = 0x228;
      bVar10 = 0;
    }
  }
  else {
    lVar7 = 0x260;
    if (((byte)tVar2 & 1) != 0) {
      lVar7 = 0x228;
    }
    bVar10 = (byte)tVar2 ^ 1;
  }
  this_00 = this + lVar7;
  lVar9 = *(long *)(this + 0x208);
  if ((this[lVar7 + 9] == (tinyusdz)0x0) && (this_00[8] == (tinyusdz)0x0)) {
    bVar6 = *(long *)(this_00 + 0x10) != *(long *)(this_00 + 0x18);
  }
  else {
    bVar6 = false;
  }
  bVar11 = *(long *)(this + 0x210) == lVar9;
  local_1e0 = __return_storage_ptr__;
  bVar5 = AttrMetas::authored((AttrMetas *)this);
  indent_00 = (uint32_t)lVar9;
  n_01 = n;
  if (((!bVar11 | bVar6) & ~(bVar5 | (bVar10 | (byte)tVar3) & bVar11) & (byte)tVar3) == 0) {
    if (tVar3 == (tinyusdz)0x0) {
      pprint::Indent_abi_cxx11_(&local_210,(pprint *)local_1f0,n);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      paVar1 = &local_210.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_210.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
      local_210.field_2._M_allocated_capacity._4_2_ = 0x3274;
      local_210._M_string_length = 6;
      local_210.field_2._M_local_buf[6] = '\0';
      local_210._M_dataplus._M_p = (pointer)paVar1;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)(local_1e8->_metas).interpolation,
                 (long)(local_1e8->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      print_animatable_default<std::array<float,2ul>>(&local_210,this_00,local_1f0,indent_00);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    }
    else {
      pprint::Indent_abi_cxx11_(&local_210,(pprint *)local_1f0,n);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      paVar1 = &local_210.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_210.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
      local_210.field_2._M_allocated_capacity._4_2_ = 0x3274;
      local_210._M_string_length = 6;
      local_210.field_2._M_local_buf[6] = '\0';
      local_210._M_dataplus._M_p = (pointer)paVar1;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)(local_1e8->_metas).interpolation,
                 (long)(local_1e8->_metas).elementSize);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT17(local_210.field_2._M_local_buf[7],
                               CONCAT16(local_210.field_2._M_local_buf[6],
                                        CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                 local_210.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    bVar6 = AttrMetas::authored((AttrMetas *)this);
    if (bVar6) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      pAVar4 = local_1f0;
      print_attr_metas_abi_cxx11_(&local_210,this,(AttrMeta *)(ulong)((int)local_1f0 + 1),indent_00)
      ;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)pAVar4 & 0xffffffff),n_00);
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  __return_storage_ptr__ = local_1e0;
  if (this_00[0x28] == (tinyusdz)0x1) {
    TypedTimeSamples<std::array<float,_2UL>_>::update
              ((TypedTimeSamples<std::array<float,_2UL>_> *)(this_00 + 0x10));
    n_01 = extraout_EDX_00;
  }
  if (*(long *)(this_00 + 0x18) != *(long *)(this_00 + 0x10)) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)local_1f0,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    paVar1 = &local_210.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT17(local_210.field_2._M_local_buf[7],
                               CONCAT16(local_210.field_2._M_local_buf[6],
                                        CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                 local_210.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_210.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_210.field_2._M_allocated_capacity._4_2_ = 0x3274;
    local_210._M_string_length = 6;
    local_210.field_2._M_local_buf[6] = '\0';
    local_210._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(char *)(local_1e8->_metas).interpolation,
               (long)(local_1e8->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT17(local_210.field_2._M_local_buf[7],
                               CONCAT16(local_210.field_2._M_local_buf[6],
                                        CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                 local_210.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    print_animatable_timesamples<std::array<float,2ul>>(&local_210,this_00,local_1f0,indent_00);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT17(local_210.field_2._M_local_buf[7],
                               CONCAT16(local_210.field_2._M_local_buf[6],
                                        CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                 local_210.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_01;
  }
  if (*(long *)(this + 0x210) != *(long *)(this + 0x208)) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)local_1f0,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    paVar1 = &local_210.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT17(local_210.field_2._M_local_buf[7],
                               CONCAT16(local_210.field_2._M_local_buf[6],
                                        CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                 local_210.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_210.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_210.field_2._M_allocated_capacity._4_2_ = 0x3274;
    local_210._M_string_length = 6;
    local_210.field_2._M_local_buf[6] = '\0';
    local_210._M_dataplus._M_p = (pointer)paVar1;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(char *)(local_1e8->_metas).interpolation,
               (long)(local_1e8->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT17(local_210.field_2._M_local_buf[7],
                               CONCAT16(local_210.field_2._M_local_buf[6],
                                        CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                 local_210.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    lVar7 = (*(long *)(this + 0x210) - (long)*(Path **)(this + 0x208) >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar7 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar7 == 1) {
      ::std::operator<<(local_1a8,*(Path **)(this + 0x208));
    }
    else {
      ::std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x208));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
LAB_002dbcd2:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    bool is_connection = attr.is_connection();
    bool is_timesamples = v.is_timesamples();
    bool has_value = attr.has_value();
    bool is_value_empty = attr.is_value_empty();

    DCOUT("name " << name);
    DCOUT("is_value_empty " << attr.is_value_empty());
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("has_value " << has_value);

    if (attr.metas().authored() || has_value || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      if (has_value) {
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
        ss << " = " << print_animatable_default(v, indent);

      } else { // attr.is_value_empty()
        // declare only
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = " << print_animatable_timesamples(v, indent);
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }

  return ss.str();
}